

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configuration.c
# Opt level: O2

char * get_yanglint_dir(void)

{
  __uid_t __uid;
  int iVar1;
  passwd *ppVar2;
  size_t sVar3;
  char *pcVar4;
  int *piVar5;
  char *pcVar6;
  char *__format;
  FILE *pFVar7;
  
  __uid = getuid();
  ppVar2 = getpwuid(__uid);
  pFVar7 = _stderr;
  if (ppVar2 == (passwd *)0x0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    pcVar4 = "Determining home directory failed (%s).\n";
  }
  else {
    pcVar6 = ppVar2->pw_dir;
    sVar3 = strlen(pcVar6);
    pcVar4 = (char *)malloc(sVar3 + 0xb);
    pFVar7 = _stderr;
    if (pcVar4 != (char *)0x0) {
      sprintf(pcVar4,"%s/%s",pcVar6,".yanglint");
      iVar1 = access(pcVar4,5);
      if (iVar1 != -1) {
        return pcVar4;
      }
      piVar5 = __errno_location();
      pFVar7 = _stderr;
      if (*piVar5 == 2) {
        fprintf(_stdout,"Configuration directory \"%s\" does not exist, creating it.\n",pcVar4);
        iVar1 = mkdir(pcVar4,0x1c0);
        pFVar7 = _stderr;
        if (iVar1 == 0) {
          return pcVar4;
        }
        pcVar6 = strerror(*piVar5);
        __format = "Configuration directory \"%s\" cannot be created (%s).\n";
      }
      else {
        pcVar6 = strerror(*piVar5);
        __format = "Configuration directory \"%s\" exists but cannot be accessed (%s).\n";
      }
      fprintf(pFVar7,__format,pcVar4,pcVar6);
      free(pcVar4);
      return (char *)0x0;
    }
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    pcVar4 = "Memory allocation failed (%s).\n";
  }
  fprintf(pFVar7,pcVar4,pcVar6);
  return (char *)0x0;
}

Assistant:

char *
get_yanglint_dir(void)
{
    int ret;
    struct passwd *pw;
    char *user_home, *yl_dir;

    if (!(pw = getpwuid(getuid()))) {
        fprintf(stderr, "Determining home directory failed (%s).\n", strerror(errno));
        return NULL;
    }
    user_home = pw->pw_dir;

    yl_dir = malloc(strlen(user_home) + 1 + strlen(YL_DIR) + 1);
    if (!yl_dir) {
        fprintf(stderr, "Memory allocation failed (%s).\n", strerror(errno));
        return NULL;
    }
    sprintf(yl_dir, "%s/%s", user_home, YL_DIR);

    ret = access(yl_dir, R_OK | X_OK);
    if (ret == -1) {
        if (errno == ENOENT) {
            /* directory does not exist */
            fprintf(stdout, "Configuration directory \"%s\" does not exist, creating it.\n", yl_dir);
            if (mkdir(yl_dir, 00700)) {
                fprintf(stderr, "Configuration directory \"%s\" cannot be created (%s).\n", yl_dir, strerror(errno));
                free(yl_dir);
                return NULL;
            }
        } else {
            fprintf(stderr, "Configuration directory \"%s\" exists but cannot be accessed (%s).\n", yl_dir, strerror(errno));
            free(yl_dir);
            return NULL;
        }
    }

    return yl_dir;
}